

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O0

void __thiscall
mjs::gc_vector<mjs::value_representation>::ensure_capacity
          (gc_vector<mjs::value_representation> *this)

{
  gc_table *pgVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  gc_table local_30;
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>::gc_table,_true> local_1c;
  gc_table *local_18;
  gc_table *t;
  gc_vector<mjs::value_representation> *this_local;
  
  t = (gc_table *)this;
  local_18 = tab(this);
  uVar2 = gc_table::length(local_18);
  uVar3 = gc_table::capacity(local_18);
  pgVar1 = local_18;
  if (uVar2 == uVar3) {
    gc_table::capacity(local_18);
    gc_table::copy_with_increased_capacity(&local_30,(uint32_t)pgVar1);
    gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>::gc_table,_true>::
    gc_heap_ptr_untracked
              (&local_1c,
               (gc_heap_ptr<mjs::gc_vector<mjs::value_representation>::gc_table> *)&local_30);
    (this->table_).pos_ = local_1c.pos_;
    gc_heap_ptr<mjs::gc_vector<mjs::value_representation>::gc_table>::~gc_heap_ptr
              ((gc_heap_ptr<mjs::gc_vector<mjs::value_representation>::gc_table> *)&local_30);
  }
  return;
}

Assistant:

void ensure_capacity() {
        auto& t = tab();
        if (t.length() == t.capacity()) {
            table_ = t.copy_with_increased_capacity(2 * t.capacity());
        }
    }